

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::monotonic_buffer_resource::monotonic_buffer_resource
          (monotonic_buffer_resource *this,memory_resource *upstream)

{
  (this->super_memory_resource)._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_030105b0;
  this->upstreamResource = upstream;
  this->blockSize = 0x40000;
  (this->currentBlock).ptr = (void *)0x0;
  (this->currentBlock).size = 0;
  this->currentBlockPos = 0;
  (this->usedBlocks).
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->usedBlocks;
  (this->usedBlocks).
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->usedBlocks;
  (this->usedBlocks).
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  (this->availableBlocks).
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->availableBlocks;
  (this->availableBlocks).
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->availableBlocks;
  (this->availableBlocks).
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

explicit monotonic_buffer_resource(memory_resource *upstream)
        : upstreamResource(upstream) {}